

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O2

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::~SPxBasisBase(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this)

{
  this->_vptr_SPxBasisBase = (_func_int **)&PTR_change_00546750;
  if (this->freeSlinSolver == true) {
    if (this->factor !=
        (SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x0) {
      (*this->factor->_vptr_SLinSolver[0x1c])();
    }
    this->factor = (SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)0x0;
  }
  (**this->theTime->_vptr_Timer)();
  spx_free<soplex::Timer*>(&this->theTime);
  Desc::~Desc(&this->thedesc);
  DataArray<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_*>
  ::~DataArray(&this->matrix);
  DataArray<soplex::SPxId>::~DataArray(&this->theBaseId);
  return;
}

Assistant:

SPxBasisBase<R>::~SPxBasisBase()
{

   assert(!freeSlinSolver || factor != nullptr);

   if(freeSlinSolver)
   {
      delete factor;
      factor = nullptr;
   }

   theTime->~Timer();
   spx_free(theTime);
}